

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

size_t __thiscall CoreML::Specification::DoubleVector::ByteSizeLong(DoubleVector *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  
  uVar3 = (ulong)(uint)(this->vector_).current_size_;
  lVar1 = uVar3 * 8;
  if (uVar3 == 0) {
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    uVar5 = (uint)lVar1;
    if ((int)uVar5 < 0) {
      uVar3 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar3 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_vector_cached_byte_size_ = uVar5;
  sVar4 = uVar3 + lVar1;
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}